

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O2

void Ptex::v2_2::(anonymous_namespace)::ApplyS<float,4>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int nTxChan)

{
  byte bVar1;
  int iVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  VecAccum<float,_4> local_71;
  long local_70;
  PtexSeparableKernel *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  bVar1 = (k->res).ulog2;
  iVar2 = k->uw;
  pfVar3 = k->kv;
  pfVar5 = (float *)((long)data + (long)(((k->v << (bVar1 & 0x1f)) + k->u) * nTxChan) * 4);
  local_70 = (long)(nTxChan << (bVar1 & 0x1f));
  local_58 = pfVar5 + k->vw * local_70;
  local_70 = local_70 << 2;
  local_68 = k;
  local_60 = result;
  for (; pfVar5 != local_58; pfVar5 = (float *)((long)pfVar5 + local_70)) {
    pfVar6 = local_68->ku;
    fStack_3c = *pfVar6;
    local_48 = fStack_3c * *pfVar5;
    fStack_44 = fStack_3c * pfVar5[1];
    fStack_40 = fStack_3c * pfVar5[2];
    fStack_3c = fStack_3c * pfVar5[3];
    local_50 = pfVar3;
    for (lVar4 = (long)nTxChan * 4; pfVar6 = pfVar6 + 1, (long)(iVar2 * nTxChan) * 4 != lVar4;
        lVar4 = lVar4 + (long)nTxChan * 4) {
      PtexUtils::VecAccum<float,_4>::operator()
                (&local_71,&local_48,(float *)(lVar4 + (long)pfVar5),*pfVar6);
    }
    pfVar3 = local_50 + 1;
    PtexUtils::VecAccum<float,_4>::operator()(&local_71,local_60,&local_48,*local_50);
  }
  return;
}

Assistant:

void ApplyS(PtexSeparableKernel& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nTxChan;
        int datalen = k.uw * nTxChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nTxChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMult<T,nChan>()(rowResult, p, *kup++);
            p += nTxChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccum<T,nChan>()(rowResult, p, *kup++);
                p += nTxChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccum<float,nChan>()(result, rowResult, *kvp++);
            p += rowskip;
        }
    }